

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/thread.c++:141:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_thread_c__:141:3)>
      *this)

{
  ThreadState *pTVar1;
  Iface *pIVar2;
  Disposer *pDVar3;
  
  pTVar1 = *(this->func).state;
  pDVar3 = (pTVar1->func).impl.disposer;
  pIVar2 = (pTVar1->func).impl.ptr;
  (pTVar1->func).impl.ptr = (Iface *)0x0;
  (**((pTVar1->initializer).impl.ptr)->_vptr_Iface)();
  if (pIVar2 != (Iface *)0x0) {
    (**pDVar3->_vptr_Disposer)(pDVar3,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  return;
}

Assistant:

void run() override {
    func();
  }